

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int available_hreg_p(int hreg,MIR_reg_t type,int nregs,bitmap_t *conflict_locs,
                    live_range_t_conflict lr)

{
  int iVar1;
  MIR_reg_t MVar2;
  int local_30;
  MIR_reg_t curr_hreg;
  int k;
  int j;
  live_range_t_conflict lr_local;
  bitmap_t *conflict_locs_local;
  int nregs_local;
  MIR_reg_t type_local;
  int hreg_local;
  
  curr_hreg = lr->start;
  while( true ) {
    if (lr->finish < (int)curr_hreg) {
      return 1;
    }
    iVar1 = bitmap_bit_p(conflict_locs[(int)curr_hreg],(long)hreg);
    if (iVar1 != 0) break;
    if (1 < nregs) {
      MVar2 = target_nth_loc(hreg,type,nregs + -1);
      if (0x21 < MVar2) {
        return 0;
      }
      for (local_30 = nregs + -1; 0 < local_30; local_30 = local_30 + -1) {
        MVar2 = target_nth_loc(hreg,type,local_30);
        iVar1 = bitmap_bit_p(conflict_locs[(int)curr_hreg],(ulong)MVar2);
        if (iVar1 != 0) {
          return 0;
        }
      }
    }
    curr_hreg = curr_hreg + 1;
  }
  return 0;
}

Assistant:

static int available_hreg_p (int hreg, MIR_reg_t type, int nregs, bitmap_t *conflict_locs,
                             live_range_t lr) {
  for (int j = lr->start; j <= lr->finish; j++) {
    if (bitmap_bit_p (conflict_locs[j], hreg)) return FALSE;
    if (nregs > 1) {
      if (target_nth_loc (hreg, type, nregs - 1) > MAX_HARD_REG) return FALSE;
      for (int k = nregs - 1; k > 0; k--) {
        MIR_reg_t curr_hreg = target_nth_loc (hreg, type, k);
        if (bitmap_bit_p (conflict_locs[j], curr_hreg)) return FALSE;
      }
    }
  }
  return TRUE;
}